

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void dropCell(MemPage *pPage,int idx,int sz,int *pRC)

{
  ulong uVar1;
  u8 uVar2;
  u8 uVar3;
  byte bVar4;
  u8 uVar5;
  u8 uVar6;
  byte bVar7;
  u8 *puVar8;
  u8 *puVar9;
  u8 *puVar10;
  byte bVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ushort uVar19;
  uint uVar20;
  long lVar21;
  
  if (*pRC != 0) {
    return;
  }
  puVar8 = pPage->aData;
  puVar10 = pPage->aCellIdx;
  lVar21 = (long)idx;
  uVar2 = puVar10[lVar21 * 2];
  uVar3 = puVar10[lVar21 * 2 + 1];
  uVar19 = CONCAT11(uVar2,uVar3);
  bVar4 = pPage->hdrOffset;
  if ((uint)(ushort)(*(ushort *)(puVar8 + (ulong)bVar4 + 5) << 8 |
                    *(ushort *)(puVar8 + (ulong)bVar4 + 5) >> 8) <= (uint)uVar19) {
    uVar17 = pPage->pBt->usableSize;
    if ((uint)uVar19 + sz <= uVar17) {
      bVar11 = bVar4;
      if ((pPage->pBt->btsFlags & 4) != 0) {
        memset(puVar8 + uVar19,0,(long)sz);
        bVar11 = pPage->hdrOffset;
        uVar17 = pPage->pBt->usableSize;
      }
      puVar10 = puVar10 + lVar21 * 2;
      uVar12 = (ulong)bVar11;
      uVar1 = uVar12 + 1;
      uVar14 = uVar1;
      do {
        uVar5 = puVar8[uVar14];
        uVar6 = puVar8[uVar14 + 1];
        uVar18 = (uint)CONCAT11(uVar5,uVar6);
        if ((uVar19 <= uVar18) || (uVar18 == 0)) {
          uVar13 = 0xc6b2;
          if ((int)(uVar17 - 4) < (int)uVar18) goto LAB_00142d17;
          puVar8[uVar14] = uVar2;
          puVar8[uVar14 + 1] = uVar3;
          puVar8[uVar19] = uVar5;
          puVar8[(ulong)uVar19 + 1] = uVar6;
          puVar8[(ulong)uVar19 + 2] = (u8)((uint)sz >> 8);
          puVar8[(ulong)uVar19 + 3] = (u8)sz;
          pPage->nFree = pPage->nFree + (short)sz;
          bVar11 = puVar8[uVar1];
          uVar17 = (uint)CONCAT11(bVar11,puVar8[uVar12 + 2]);
          uVar14 = uVar1;
          if (uVar17 == 0) goto LAB_00142e35;
          goto LAB_00142d7e;
        }
        iVar16 = (int)uVar14;
        uVar14 = (ulong)uVar18;
      } while (iVar16 + 4U <= uVar18);
      uVar13 = 0xc6ad;
      goto LAB_00142d17;
    }
  }
  uVar13 = 0xd79b;
LAB_00142d17:
  sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar13,
              "118a3b35693b134d56ebd780123b7fd6f1497668");
  *pRC = 0xb;
  return;
LAB_00142d7e:
  uVar15 = (ulong)uVar17;
  uVar2 = puVar8[uVar15];
  uVar3 = puVar8[uVar15 + 1];
  uVar19 = *(ushort *)(puVar8 + uVar15 + 2) << 8 | *(ushort *)(puVar8 + uVar15 + 2) >> 8;
  if (CONCAT11(uVar2,uVar3) - 1 < uVar19 + uVar17 + 3) {
    uVar18 = (uint)CONCAT11(uVar2,uVar3);
    uVar20 = uVar18 - (uVar19 + uVar17);
    uVar13 = 0xc6c5;
    if (((int)uVar20 < 0) || (puVar8[uVar12 + 7] < uVar20)) goto LAB_00142d17;
    puVar8[uVar12 + 7] = puVar8[uVar12 + 7] - (char)uVar20;
    *(undefined2 *)(puVar8 + uVar15) = *(undefined2 *)(puVar8 + uVar18);
    uVar19 = (CONCAT11(uVar2,uVar3) - (short)uVar17) +
             CONCAT11(puVar8[(ulong)uVar18 + 2],puVar8[(ulong)uVar18 + 3]);
    *(ushort *)(puVar8 + uVar15 + 2) = uVar19 * 0x100 | uVar19 >> 8;
    uVar2 = puVar8[uVar14];
    uVar3 = puVar8[uVar14 + 1];
    uVar15 = uVar14;
  }
  uVar17 = (uint)CONCAT11(uVar2,uVar3);
  uVar14 = uVar15;
  if (uVar17 == 0) {
    bVar11 = puVar8[uVar1];
LAB_00142e35:
    if (bVar11 == puVar8[uVar12 + 5]) {
      bVar7 = puVar8[uVar12 + 2];
      if (bVar7 == puVar8[uVar12 + 6]) {
        lVar21 = (ulong)bVar11 * 0x100 + (ulong)bVar7;
        *(undefined2 *)(puVar8 + uVar1) = *(undefined2 *)(puVar8 + lVar21);
        uVar19 = CONCAT11(puVar8[lVar21 + 2],puVar8[lVar21 + 3]) + CONCAT11(bVar11,bVar7);
        *(ushort *)(puVar8 + uVar12 + 5) = uVar19 * 0x100 | uVar19 >> 8;
      }
    }
    puVar9 = pPage->aCellIdx;
    uVar19 = pPage->nCell;
    if (puVar10 < puVar9 + (ulong)uVar19 * 2 + -2) {
      do {
        *(undefined2 *)puVar10 = *(undefined2 *)(puVar10 + 2);
        puVar10 = puVar10 + 2;
      } while (puVar10 < puVar9 + (ulong)uVar19 * 2 + -2);
      uVar19 = pPage->nCell;
    }
    pPage->nCell = (u16)(uVar19 - 1);
    puVar8[(ulong)bVar4 + 3] = (u8)(uVar19 - 1 >> 8);
    puVar8[(ulong)bVar4 + 4] = (u8)pPage->nCell;
    pPage->nFree = pPage->nFree + 2;
    return;
  }
  goto LAB_00142d7e;
}

Assistant:

static void dropCell(MemPage *pPage, int idx, int sz, int *pRC){
  u32 pc;         /* Offset to cell content of cell being deleted */
  u8 *data;       /* pPage->aData */
  u8 *ptr;        /* Used to move bytes around within data[] */
  u8 *endPtr;     /* End of loop */
  int rc;         /* The return code */
  int hdr;        /* Beginning of the header.  0 most pages.  100 page 1 */

  if( *pRC ) return;

  assert( idx>=0 && idx<pPage->nCell );
  assert( sz==cellSize(pPage, idx) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  ptr = &pPage->aCellIdx[2*idx];
  pc = get2byte(ptr);
  hdr = pPage->hdrOffset;
  testcase( pc==get2byte(&data[hdr+5]) );
  testcase( pc+sz==pPage->pBt->usableSize );
  if( pc < (u32)get2byte(&data[hdr+5]) || pc+sz > pPage->pBt->usableSize ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  rc = freeSpace(pPage, pc, sz);
  if( rc ){
    *pRC = rc;
    return;
  }
  endPtr = &pPage->aCellIdx[2*pPage->nCell - 2];
  assert( (SQLITE_PTR_TO_INT(ptr)&1)==0 );  /* ptr is always 2-byte aligned */
  while( ptr<endPtr ){
    *(u16*)ptr = *(u16*)&ptr[2];
    ptr += 2;
  }
  pPage->nCell--;
  put2byte(&data[hdr+3], pPage->nCell);
  pPage->nFree += 2;
}